

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

void ProcessThread::addPid(pid_t pid,Process *process,bool async)

{
  _Atomic_word *p_Var1;
  _Hash_node_base *p_Var2;
  Process *this;
  int iVar3;
  Event *event;
  mapped_type *pmVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  _Node_iterator_base<std::pair<const_int,_int>,_false> __it;
  int local_5c;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  Process *local_48;
  __weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_5c = pid;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&sProcessMutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  sPending = sPending + -1;
  if (sPendingPids._M_h._M_element_count != 0) {
    p_Var5 = sPendingPids._M_h._M_buckets[(ulong)(long)local_5c % sPendingPids._M_h._M_bucket_count]
    ;
    p_Var6 = (__node_base_ptr)0x0;
    if ((p_Var5 != (__node_base_ptr)0x0) &&
       (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, local_5c != *(int *)&p_Var5->_M_nxt[1]._M_nxt)) {
      while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
        p_Var6 = (__node_base_ptr)0x0;
        if (((ulong)(long)*(int *)&p_Var2[1]._M_nxt % sPendingPids._M_h._M_bucket_count !=
             (ulong)(long)local_5c % sPendingPids._M_h._M_bucket_count) ||
           (p_Var6 = p_Var5, local_5c == *(int *)&p_Var2[1]._M_nxt)) goto LAB_00171157;
      }
      p_Var6 = (__node_base_ptr)0x0;
    }
LAB_00171157:
    if (p_Var6 == (__node_base_ptr)0x0) {
      __it._M_cur = (__node_type *)0x0;
    }
    else {
      __it._M_cur = (__node_type *)p_Var6->_M_nxt;
    }
    if (__it._M_cur != (__node_type *)0x0) {
      iVar3 = *(int *)((long)__it._M_cur + 0xc);
      if (async) {
        EventLoop::eventLoop();
        this = local_48;
        event = (Event *)operator_new(0x20);
        event->_vptr_Event = (_func_int **)&PTR__Event_001917a0;
        event[1]._vptr_Event = (_func_int **)process;
        *(int *)&event[2]._vptr_Event = iVar3;
        EventLoop::post((EventLoop *)this,event);
        if (local_40._M_ptr != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_ptr);
        }
      }
      else {
        Process::finish(process,iVar3);
      }
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&sPendingPids._M_h,(const_iterator)__it._M_cur);
      goto LAB_00171295;
    }
  }
  local_48 = process;
  if (async) {
    EventLoop::eventLoop();
  }
  else {
    local_58 = (element_type *)0x0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  local_40._M_ptr = local_58;
  local_40._M_refcount._M_pi = p_Stack_50;
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_50->_M_weak_count = p_Stack_50->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_50->_M_weak_count = p_Stack_50->_M_weak_count + 1;
    }
  }
  pmVar4 = std::
           map<int,_ProcessThread::ProcessData,_std::less<int>,_std::allocator<std::pair<const_int,_ProcessThread::ProcessData>_>_>
           ::operator[](&sProcesses,&local_5c);
  pmVar4->proc = local_48;
  std::__weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar4->loop).super___weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>,&local_40);
  if (local_40._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_40._M_refcount._M_pi)->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = (local_40._M_refcount._M_pi)->_M_weak_count;
      (local_40._M_refcount._M_pi)->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*(local_40._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
LAB_00171295:
  if (sPending == 0) {
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&sPendingPids._M_h);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&sProcessMutex);
  return;
}

Assistant:

void ProcessThread::addPid(pid_t pid, Process* process, bool async)
{
    std::lock_guard<std::mutex> lock(sProcessMutex);
    sPending -= 1;

    if (!sPendingPids.empty()) {
        // we have to check
        auto it = sPendingPids.find(pid);
        if (it != sPendingPids.end()) {
            // fire the signal now
            const int ret = it->second;
            if (async) {
                EventLoop::eventLoop()->callLater([process, ret]() { process->finish(ret); });
            } else {
                process->finish(ret);
            }
            sPendingPids.erase(it);
            if (!sPending)
                sPendingPids.clear();
            return;
        }
    }

    sProcesses[pid] = { process, async ? EventLoop::eventLoop() : EventLoop::SharedPtr() };

    if (!sPending)
        sPendingPids.clear();
}